

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_type.cpp
# Opt level: O2

string * __thiscall
duckdb::StatementTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,StatementType type)

{
  char *pcVar1;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar1 = "SELECT";
    break;
  case 2:
    pcVar1 = "INSERT";
    break;
  case 3:
    pcVar1 = "UPDATE";
    break;
  case 4:
    pcVar1 = "CREATE";
    break;
  case 5:
    pcVar1 = "DELETE";
    break;
  case 6:
    pcVar1 = "PREPARE";
    break;
  case 7:
    pcVar1 = "EXECUTE";
    break;
  case 8:
    pcVar1 = "ALTER";
    break;
  case 9:
    pcVar1 = "TRANSACTION";
    break;
  case 10:
    pcVar1 = "COPY";
    break;
  case 0xb:
    pcVar1 = "ANALYZE";
    break;
  case 0xc:
    pcVar1 = "VARIABLE_SET";
    break;
  case 0xd:
    pcVar1 = "CREATE_FUNC";
    break;
  case 0xe:
    pcVar1 = "EXPLAIN";
    break;
  case 0xf:
    pcVar1 = "DROP";
    break;
  case 0x10:
    pcVar1 = "EXPORT";
    break;
  case 0x11:
    pcVar1 = "PRAGMA";
    break;
  case 0x12:
    pcVar1 = "VACUUM";
    break;
  case 0x13:
    pcVar1 = "CALL";
    break;
  case 0x14:
    pcVar1 = "SET";
    break;
  case 0x15:
    pcVar1 = "LOAD";
    break;
  case 0x16:
    pcVar1 = "RELATION";
    break;
  case 0x17:
    pcVar1 = "EXTENSION";
    break;
  case 0x18:
    pcVar1 = "LOGICAL_PLAN";
    break;
  case 0x19:
    pcVar1 = "ATTACH";
    break;
  case 0x1a:
    pcVar1 = "DETACH";
    break;
  case 0x1b:
    pcVar1 = "MULTI";
    break;
  case 0x1c:
    pcVar1 = "COPY_DATABASE";
    break;
  case 0x1d:
    pcVar1 = "UPDATE_EXTENSIONS";
    break;
  default:
    pcVar1 = "INVALID";
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string StatementTypeToString(StatementType type) {
	switch (type) {
	case StatementType::SELECT_STATEMENT:
		return "SELECT";
	case StatementType::INSERT_STATEMENT:
		return "INSERT";
	case StatementType::UPDATE_STATEMENT:
		return "UPDATE";
	case StatementType::DELETE_STATEMENT:
		return "DELETE";
	case StatementType::PREPARE_STATEMENT:
		return "PREPARE";
	case StatementType::EXECUTE_STATEMENT:
		return "EXECUTE";
	case StatementType::ALTER_STATEMENT:
		return "ALTER";
	case StatementType::TRANSACTION_STATEMENT:
		return "TRANSACTION";
	case StatementType::COPY_STATEMENT:
		return "COPY";
	case StatementType::COPY_DATABASE_STATEMENT:
		return "COPY_DATABASE";
	case StatementType::ANALYZE_STATEMENT:
		return "ANALYZE";
	case StatementType::VARIABLE_SET_STATEMENT:
		return "VARIABLE_SET";
	case StatementType::CREATE_FUNC_STATEMENT:
		return "CREATE_FUNC";
	case StatementType::EXPLAIN_STATEMENT:
		return "EXPLAIN";
	case StatementType::CREATE_STATEMENT:
		return "CREATE";
	case StatementType::DROP_STATEMENT:
		return "DROP";
	case StatementType::PRAGMA_STATEMENT:
		return "PRAGMA";
	case StatementType::VACUUM_STATEMENT:
		return "VACUUM";
	case StatementType::RELATION_STATEMENT:
		return "RELATION";
	case StatementType::EXPORT_STATEMENT:
		return "EXPORT";
	case StatementType::CALL_STATEMENT:
		return "CALL";
	case StatementType::SET_STATEMENT:
		return "SET";
	case StatementType::LOAD_STATEMENT:
		return "LOAD";
	case StatementType::EXTENSION_STATEMENT:
		return "EXTENSION";
	case StatementType::LOGICAL_PLAN_STATEMENT:
		return "LOGICAL_PLAN";
	case StatementType::ATTACH_STATEMENT:
		return "ATTACH";
	case StatementType::DETACH_STATEMENT:
		return "DETACH";
	case StatementType::MULTI_STATEMENT:
		return "MULTI";
	case StatementType::UPDATE_EXTENSIONS_STATEMENT:
		return "UPDATE_EXTENSIONS";
	case StatementType::INVALID_STATEMENT:
		break;
	}
	return "INVALID";
}